

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O1

Debug * __thiscall Corrade::Utility::Debug::operator<<(Debug *this,uchar value)

{
  byte bVar1;
  Debug *pDVar2;
  undefined7 in_register_00000031;
  int v;
  char *shade;
  int local_34;
  char *local_30;
  char *local_28;
  
  local_34 = (int)CONCAT71(in_register_00000031,value);
  bVar1 = (this->_immediateFlags)._value | (this->_flags)._value;
  if ((bVar1 & 0x10) == 0) {
    this = print<int>(this,&local_34);
  }
  else {
    if (value < 0x33) {
      local_28 = "  ";
    }
    else if (value < 0x66) {
      local_28 = anon_var_dwarf_bff84;
    }
    else if (value < 0x99) {
      local_28 = anon_var_dwarf_bff9b;
    }
    else if (value < 0xcc) {
      local_28 = anon_var_dwarf_bffa6;
    }
    else {
      local_28 = anon_var_dwarf_bffb1;
    }
    if ((bVar1 & 2) == 0) {
      print<char[8]>(this,(char (*) [8])"\x1b[38;2;");
      bVar1 = (this->_flags)._value;
      (this->_flags)._value = bVar1 | 4;
      local_30 = (char *)CONCAT44(local_30._4_4_,local_34);
      pDVar2 = print<int>(this,(int *)&local_30);
      local_30 = ";";
      pDVar2 = print<char_const*>(pDVar2,&local_30);
      local_30 = (char *)CONCAT44(local_30._4_4_,local_34);
      pDVar2 = print<int>(pDVar2,(int *)&local_30);
      local_30 = ";";
      pDVar2 = print<char_const*>(pDVar2,&local_30);
      local_30 = (char *)CONCAT44(local_30._4_4_,local_34);
      pDVar2 = print<int>(pDVar2,(int *)&local_30);
      local_30 = "m\x1b[48;2;";
      pDVar2 = print<char_const*>(pDVar2,&local_30);
      local_30 = (char *)CONCAT44(local_30._4_4_,local_34);
      pDVar2 = print<int>(pDVar2,(int *)&local_30);
      local_30 = ";";
      pDVar2 = print<char_const*>(pDVar2,&local_30);
      local_30 = (char *)CONCAT44(local_30._4_4_,local_34);
      pDVar2 = print<int>(pDVar2,(int *)&local_30);
      local_30 = ";";
      pDVar2 = print<char_const*>(pDVar2,&local_30);
      local_30 = (char *)CONCAT44(local_30._4_4_,local_34);
      pDVar2 = print<int>(pDVar2,(int *)&local_30);
      local_30 = "m";
      pDVar2 = print<char_const*>(pDVar2,&local_30);
      local_30 = local_28;
      pDVar2 = print<char_const*>(pDVar2,&local_30);
      local_30 = "\x1b[0m";
      print<char_const*>(pDVar2,&local_30);
      (this->_flags)._value = bVar1;
    }
    else {
      this = print<char_const*>(this,&local_28);
    }
  }
  return this;
}

Assistant:

Debug& Debug::operator<<(unsigned char value) {
    /* Convert to int to avoid infinite recursion to operator<<(unsigned char) */
    const int v = value;

    /* Print the value as a shade of gray */
    if((_immediateFlags|_flags) & Flag::Color) {
        const char* shade;
        if(value < 51)       shade = "  ";
        else if(value < 102) shade = "░░";
        else if(value < 153) shade = "▒▒";
        else if(value < 204) shade = "▓▓";
        else                 shade = "██";

        /* If ANSI colors are disabled, use just the shade */
        if((_immediateFlags|_flags) & Flag::DisableColors)
            return print(shade);
        else {
            print("\033[38;2;");

            /* Disable space between values for everything after the initial
               value */
            const Flags previousFlags = _flags;
            _flags = previousFlags|Flag::NoSpace;

            /* Set both background and foreground, reset back after */
            *this << v << ";" << v << ";" << v << "m\033[48;2;"
                << v << ";" << v << ";" << v << "m" << shade << "\033[0m";

            /* Reset original flags */
            _flags = previousFlags;
            return *this;
        }

    /* Otherwise print its numeric value */
    } else return print(v);
}